

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreePrevious(BtCursor *pCur,int *pRes)

{
  int *pRes_local;
  BtCursor *pCur_local;
  
  *pRes = 0;
  pCur->curFlags = pCur->curFlags & 0xf1;
  (pCur->info).nSize = 0;
  if (((pCur->eState == '\x01') && (pCur->aiIdx[pCur->iPage] != 0)) &&
     (pCur->apPage[pCur->iPage]->leaf != '\0')) {
    pCur->aiIdx[pCur->iPage] = pCur->aiIdx[pCur->iPage] - 1;
    pCur_local._4_4_ = 0;
  }
  else {
    pCur_local._4_4_ = btreePrevious(pCur,pRes);
  }
  return pCur_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePrevious(BtCursor *pCur, int *pRes){
  assert( cursorOwnsBtShared(pCur) );
  assert( pRes!=0 );
  assert( *pRes==0 || *pRes==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  *pRes = 0;
  pCur->curFlags &= ~(BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey);
  pCur->info.nSize = 0;
  if( pCur->eState!=CURSOR_VALID
   || pCur->aiIdx[pCur->iPage]==0
   || pCur->apPage[pCur->iPage]->leaf==0
  ){
    return btreePrevious(pCur, pRes);
  }
  pCur->aiIdx[pCur->iPage]--;
  return SQLITE_OK;
}